

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::DirectStateAccess::Textures::GetImageTest::iterate(GetImageTest *this)

{
  ostringstream *poVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ContextType ctxType;
  deUint32 dVar6;
  undefined4 extraout_var;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  qpTestResult testResult;
  GetImageTest *pGVar11;
  TestContext *this_00;
  GLuint texture;
  string local_230;
  GLubyte result_compressed [8];
  string local_208;
  GLubyte result [64];
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  long lVar7;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar4 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar3) || (bVar4)) {
    texture = 0;
    result[0x30] = '\0';
    result[0x31] = '\0';
    result[0x32] = '\0';
    result[0x33] = '\0';
    result[0x34] = '\0';
    result[0x35] = '\0';
    result[0x36] = '\0';
    result[0x37] = '\0';
    result[0x38] = '\0';
    result[0x39] = '\0';
    result[0x3a] = '\0';
    result[0x3b] = '\0';
    result[0x3c] = '\0';
    result[0x3d] = '\0';
    result[0x3e] = '\0';
    result[0x3f] = '\0';
    result[0x20] = '\0';
    result[0x21] = '\0';
    result[0x22] = '\0';
    result[0x23] = '\0';
    result[0x24] = '\0';
    result[0x25] = '\0';
    result[0x26] = '\0';
    result[0x27] = '\0';
    result[0x28] = '\0';
    result[0x29] = '\0';
    result[0x2a] = '\0';
    result[0x2b] = '\0';
    result[0x2c] = '\0';
    result[0x2d] = '\0';
    result[0x2e] = '\0';
    result[0x2f] = '\0';
    result[0x10] = '\0';
    result[0x11] = '\0';
    result[0x12] = '\0';
    result[0x13] = '\0';
    result[0x14] = '\0';
    result[0x15] = '\0';
    result[0x16] = '\0';
    result[0x17] = '\0';
    result[0x18] = '\0';
    result[0x19] = '\0';
    result[0x1a] = '\0';
    result[0x1b] = '\0';
    result[0x1c] = '\0';
    result[0x1d] = '\0';
    result[0x1e] = '\0';
    result[0x1f] = '\0';
    result[0] = '\0';
    result[1] = '\0';
    result[2] = '\0';
    result[3] = '\0';
    result[4] = '\0';
    result[5] = '\0';
    result[6] = '\0';
    result[7] = '\0';
    result[8] = '\0';
    result[9] = '\0';
    result[10] = '\0';
    result[0xb] = '\0';
    result[0xc] = '\0';
    result[0xd] = '\0';
    result[0xe] = '\0';
    result[0xf] = '\0';
    result_compressed[0] = '\0';
    result_compressed[1] = '\0';
    result_compressed[2] = '\0';
    result_compressed[3] = '\0';
    result_compressed[4] = '\0';
    result_compressed[5] = '\0';
    result_compressed[6] = '\0';
    result_compressed[7] = '\0';
    (**(code **)(lVar7 + 0x6f8))(1);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1d28);
    (**(code **)(lVar7 + 0xb8))(0xde1,texture);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glBindTexture has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1d2b);
    (**(code **)(lVar7 + 0x1310))(0xde1,0,0x8058,4,4,0,0x1908,0x1401,&s_texture_data);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glTexImage2D has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1d2f);
    (**(code **)(lVar7 + 0xad8))(texture,0,0x1908,0x1401,0x40,result);
    iVar5 = (**(code **)(lVar7 + 0x800))();
    if (iVar5 == 0) {
      uVar2 = 0;
      do {
        uVar8 = uVar2;
        if ((&s_texture_data)[uVar8] != result[uVar8]) {
          local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          poVar1 = (ostringstream *)(local_1a8 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          pcVar10 = "GetTextureImage returned ";
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"GetTextureImage returned ",0x19);
          DataToString_abi_cxx11_(&local_230,(GetImageTest *)pcVar10,0x40,result);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,local_230._M_dataplus._M_p,
                     CONCAT44(local_230._M_string_length._4_4_,(int)local_230._M_string_length));
          pGVar11 = (GetImageTest *)0x1afdbe7;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", but ",6);
          DataToString_abi_cxx11_(&local_208,pGVar11,0x40,"");
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,local_208._M_dataplus._M_p,local_208._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1," was expected. Test fails.",0x1a);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00ad545d;
        }
        uVar2 = uVar8 + 1;
      } while (uVar8 + 1 != 0x40);
      bVar3 = 0x3e < uVar8;
    }
    else {
      local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1a8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"GetTextureImage unexpectedly generated error ",0x2d);
      local_230._M_dataplus._M_p = (pointer)glu::getErrorName;
      local_230._M_string_length._0_4_ = iVar5;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_230,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Test fails.",0xd);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00ad545d:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a8 + 8));
      std::ios_base::~ios_base(local_130);
      bVar3 = false;
    }
    (**(code **)(lVar7 + 0x480))(1,&texture);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1d55);
    texture = 0;
    (**(code **)(lVar7 + 0x6f8))(1);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1d5d);
    (**(code **)(lVar7 + 0xb8))(0xde1,texture);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glBindTexture has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1d60);
    (**(code **)(lVar7 + 0x288))(0xde1,0,0x9274,4,4,0,8,&s_texture_data_compressed);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glCompressedTexImage2D has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1d64);
    (**(code **)(lVar7 + 2000))(texture,0,8,result_compressed);
    iVar5 = (**(code **)(lVar7 + 0x800))();
    if (iVar5 == 0) {
      lVar9 = 0;
      do {
        if ((&s_texture_data_compressed)[lVar9] != result_compressed[lVar9]) {
          local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          poVar1 = (ostringstream *)(local_1a8 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          pcVar10 = "GetCompressedTextureImage returned ";
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"GetCompressedTextureImage returned ",0x23);
          DataToString_abi_cxx11_(&local_230,(GetImageTest *)pcVar10,8,result_compressed);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,local_230._M_dataplus._M_p,
                     CONCAT44(local_230._M_string_length._4_4_,(int)local_230._M_string_length));
          pGVar11 = (GetImageTest *)0x1afdbe7;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", but ",6);
          DataToString_abi_cxx11_(&local_208,pGVar11,8,&s_texture_data_compressed);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,local_208._M_dataplus._M_p,local_208._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1," was expected. Test fails.",0x1a);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00ad5719;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 8);
    }
    else {
      local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1a8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"GetCompressedTextureImage unexpectedly generated error ",0x37);
      local_230._M_dataplus._M_p = (pointer)glu::getErrorName;
      local_230._M_string_length._0_4_ = iVar5;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_230,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Test fails.",0xd);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00ad5719:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a8 + 8));
      std::ios_base::~ios_base(local_130);
      bVar3 = false;
    }
    if (texture != 0) {
      (**(code **)(lVar7 + 0x480))(1);
    }
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar3) {
      pcVar10 = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      pcVar10 = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    pcVar10 = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,pcVar10);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GetImageTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Objects. */
	glw::GLuint  texture									   = 0;
	glw::GLubyte result[s_texture_count]					   = {};
	glw::GLubyte result_compressed[s_texture_count_compressed] = {};

	try
	{
		/* Uncompressed case. */
		{
			/* Texture initiation. */
			gl.genTextures(1, &texture);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

			gl.bindTexture(GL_TEXTURE_2D, texture);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

			gl.texImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, s_texture_width, s_texture_height, 0, GL_RGBA, GL_UNSIGNED_BYTE,
						  s_texture_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D has failed");

			/* Quering image with tested function. */
			gl.getTextureImage(texture, 0, GL_RGBA, GL_UNSIGNED_BYTE, sizeof(result), result);

			/* Check for errors. */
			glw::GLenum error = GL_NO_ERROR;

			if (GL_NO_ERROR != (error = gl.getError()))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "GetTextureImage unexpectedly generated error "
					<< glu::getErrorStr(error) << ". Test fails." << tcu::TestLog::EndMessage;

				is_ok = false;
			}
			else
			{
				/* No error, so compare images. */
				for (glw::GLuint i = 0; i < s_texture_count; ++i)
				{
					if (s_texture_data[i] != result[i])
					{
						m_context.getTestContext().getLog() << tcu::TestLog::Message << "GetTextureImage returned "
															<< DataToString(s_texture_count, result) << ", but "
															<< DataToString(s_texture_count, s_texture_data)
															<< " was expected. Test fails." << tcu::TestLog::EndMessage;

						is_ok = false;

						break;
					}
				}
			}
		}

		/* Clean up texture .*/
		gl.deleteTextures(1, &texture);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

		texture = 0;

		/* Compressed case. */
		{
			/* Texture initiation. */
			gl.genTextures(1, &texture);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

			gl.bindTexture(GL_TEXTURE_2D, texture);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

			gl.compressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGB8_ETC2, s_texture_width, s_texture_height, 0,
									s_texture_size_compressed, s_texture_data_compressed);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCompressedTexImage2D has failed");

			/* Quering image with tested function. */
			gl.getCompressedTextureImage(texture, 0, s_texture_count_compressed * sizeof(result_compressed[0]),
										 result_compressed);

			/* Check for errors. */
			glw::GLenum error = GL_NO_ERROR;

			if (GL_NO_ERROR != (error = gl.getError()))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "GetCompressedTextureImage unexpectedly generated error "
					<< glu::getErrorStr(error) << ". Test fails." << tcu::TestLog::EndMessage;

				is_ok = false;
			}
			else
			{
				/* No error, so compare images. */
				for (glw::GLuint i = 0; i < s_texture_count_compressed; ++i)
				{
					if (s_texture_data_compressed[i] != result_compressed[i])
					{
						m_context.getTestContext().getLog()
							<< tcu::TestLog::Message << "GetCompressedTextureImage returned "
							<< DataToString(s_texture_count_compressed, result_compressed) << ", but "
							<< DataToString(s_texture_count_compressed, s_texture_data_compressed)
							<< " was expected. Test fails." << tcu::TestLog::EndMessage;

						is_ok = false;

						break;
					}
				}
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (texture)
	{
		gl.deleteTextures(1, &texture);
	}

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}